

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week6-app3.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  array<int,_5UL> *__range1;
  int cnt;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  array<int,_5UL> a;
  
  a._M_elems[0] = 1;
  a._M_elems[1] = 2;
  a._M_elems[2] = 3;
  a._M_elems[3] = 4;
  a._M_elems[4] = 5;
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 4) {
    piVar1 = (int *)((long)a._M_elems + lVar3);
    *piVar1 = *piVar1 + 1;
  }
  iVar5 = 0;
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 4) {
    iVar5 = iVar5 + (uint)(1 < *(int *)((long)a._M_elems + lVar3));
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Count=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar5 = 10;
  iVar6 = 0;
  iVar2 = 1;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    iVar7 = iVar6 + iVar2;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::operator<<(poVar4," ");
    iVar6 = iVar2;
    iVar2 = iVar7;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto a = array<int, 5>{1, 2, 3, 4, 5};
    transform(a, [](int& a) { ++a; }); // a is now {2, 3, 4, 5, 6}

//    auto greater_than_3 = GreaterThan3();
//    auto greater_than_3 = [](int value) { return value > 3; };
    auto greater_than_1 = [](int value) { return value > 1; };

    auto cnt = count_if(a, greater_than_1);
    cout << "Count=" << cnt << endl;

    auto fg = FiboGenerator();
    for(int i=0; i<10; ++i)
        cout << fg() << " ";
    cout << endl;

    return 0;
}